

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugTextUnformattedWithLocateItem(char *line_begin,char *line_end)

{
  bool bVar1;
  int iVar2;
  long in_RSI;
  char *in_RDI;
  ImVec2 IVar3;
  ImVec2 p1;
  ImVec2 p0;
  ImGuiID id;
  char *p;
  ImRect text_rect;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uVar5;
  char *in_stack_ffffffffffffff70;
  undefined1 clip;
  ImVec2 *this;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  float in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  ImVec2 local_5c;
  ImRect local_54;
  ImVec2 local_44;
  float _x;
  undefined4 local_34;
  char *local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImGuiContext *local_18;
  long local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  TextUnformatted(in_stack_ffffffffffffff70,
                  (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  bVar1 = IsItemHovered((ImGuiHoveredFlags)in_stack_ffffffffffffff90);
  if (bVar1) {
    local_18 = GImGui;
    local_28 = (GImGui->LastItemData).Rect.Min;
    local_20 = (GImGui->LastItemData).Rect.Max;
    for (local_30 = local_8; local_30 <= (char *)(local_10 + -10); local_30 = local_30 + 1) {
      local_34 = 0;
      if (((*local_30 == '0') &&
          (((local_30[1] == 'x' || (local_30[1] == 'X')) &&
           (iVar2 = __isoc99_sscanf(local_30 + 2,"%X",&local_34), iVar2 == 1)))) &&
         (bVar1 = ImCharIsXdigitA(local_30[10]), !bVar1)) {
        uVar4 = 0;
        uVar5 = 0xbf800000;
        IVar3 = CalcTextSize((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             SUB41((uint)in_stack_ffffffffffffff8c >> 0x18,0),
                             in_stack_ffffffffffffff88);
        _x = IVar3.x;
        local_44 = CalcTextSize((char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ),
                                (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90
                                                ),SUB41((uint)in_stack_ffffffffffffff8c >> 0x18,0),
                                in_stack_ffffffffffffff88);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff9c,_x,0.0);
        clip = (undefined1)((ulong)&local_28 >> 0x38);
        local_5c = ::operator+((ImVec2 *)CONCAT44(uVar5,uVar4),(ImVec2 *)0x20b8b7);
        this = (ImVec2 *)&stack0xffffffffffffff8c;
        ImVec2::ImVec2(this,_x + local_44.x,local_44.y);
        IVar3 = ::operator+((ImVec2 *)CONCAT44(uVar5,uVar4),(ImVec2 *)0x20b8f1);
        in_stack_ffffffffffffff94 = IVar3.x;
        in_stack_ffffffffffffff98 = IVar3.y;
        ImRect::ImRect(&local_54,&local_5c,(ImVec2 *)&stack0xffffffffffffff94);
        (local_18->LastItemData).Rect.Min = local_54.Min;
        (local_18->LastItemData).Rect.Max = local_54.Max;
        bVar1 = IsMouseHoveringRect((ImVec2 *)
                                    CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                    this,(bool)clip);
        if (bVar1) {
          DebugLocateItemOnHover((ImGuiID)_x);
        }
        local_30 = local_30 + 10;
      }
    }
  }
  return;
}

Assistant:

void ImGui::DebugTextUnformattedWithLocateItem(const char* line_begin, const char* line_end)
{
    TextUnformatted(line_begin, line_end);
    if (!IsItemHovered())
        return;
    ImGuiContext& g = *GImGui;
    ImRect text_rect = g.LastItemData.Rect;
    for (const char* p = line_begin; p <= line_end - 10; p++)
    {
        ImGuiID id = 0;
        if (p[0] != '0' || (p[1] != 'x' && p[1] != 'X') || sscanf(p + 2, "%X", &id) != 1 || ImCharIsXdigitA(p[10]))
            continue;
        ImVec2 p0 = CalcTextSize(line_begin, p);
        ImVec2 p1 = CalcTextSize(p, p + 10);
        g.LastItemData.Rect = ImRect(text_rect.Min + ImVec2(p0.x, 0.0f), text_rect.Min + ImVec2(p0.x + p1.x, p1.y));
        if (IsMouseHoveringRect(g.LastItemData.Rect.Min, g.LastItemData.Rect.Max, true))
            DebugLocateItemOnHover(id);
        p += 10;
    }
}